

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigWin.c
# Opt level: O0

void Aig_ManFindCut(Aig_Obj_t *pRoot,Vec_Ptr_t *vFront,Vec_Ptr_t *vVisited,int nSizeLimit,
                   int nFanoutLimit)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  void *pvVar3;
  int local_34;
  int i;
  Aig_Obj_t *pNode;
  int nFanoutLimit_local;
  int nSizeLimit_local;
  Vec_Ptr_t *vVisited_local;
  Vec_Ptr_t *vFront_local;
  Aig_Obj_t *pRoot_local;
  
  iVar1 = Aig_IsComplement(pRoot);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigWin.c"
                  ,0x96,"void Aig_ManFindCut(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  iVar1 = Aig_ObjIsNode(pRoot);
  if (iVar1 == 0) {
    __assert_fail("Aig_ObjIsNode(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigWin.c"
                  ,0x97,"void Aig_ManFindCut(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  pAVar2 = Aig_ObjChild0(pRoot);
  if (pAVar2 == (Aig_Obj_t *)0x0) {
    __assert_fail("Aig_ObjChild0(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigWin.c"
                  ,0x98,"void Aig_ManFindCut(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  pAVar2 = Aig_ObjChild1(pRoot);
  if (pAVar2 == (Aig_Obj_t *)0x0) {
    __assert_fail("Aig_ObjChild1(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigWin.c"
                  ,0x99,"void Aig_ManFindCut(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  Vec_PtrClear(vFront);
  pAVar2 = Aig_ObjFanin0(pRoot);
  Vec_PtrPush(vFront,pAVar2);
  pAVar2 = Aig_ObjFanin1(pRoot);
  Vec_PtrPush(vFront,pAVar2);
  Vec_PtrClear(vVisited);
  Vec_PtrPush(vVisited,pRoot);
  pAVar2 = Aig_ObjFanin0(pRoot);
  Vec_PtrPush(vVisited,pAVar2);
  pAVar2 = Aig_ObjFanin1(pRoot);
  Vec_PtrPush(vVisited,pAVar2);
  if ((*(ulong *)&pRoot->field_0x18 >> 4 & 1) != 0) {
    __assert_fail("!pRoot->fMarkA",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigWin.c"
                  ,0xa7,"void Aig_ManFindCut(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  pAVar2 = Aig_ObjFanin0(pRoot);
  if ((*(ulong *)&pAVar2->field_0x18 >> 4 & 1) != 0) {
    __assert_fail("!Aig_ObjFanin0(pRoot)->fMarkA",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigWin.c"
                  ,0xa8,"void Aig_ManFindCut(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  pAVar2 = Aig_ObjFanin1(pRoot);
  if ((*(ulong *)&pAVar2->field_0x18 >> 4 & 1) != 0) {
    __assert_fail("!Aig_ObjFanin1(pRoot)->fMarkA",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigWin.c"
                  ,0xa9,"void Aig_ManFindCut(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  *(ulong *)&pRoot->field_0x18 = *(ulong *)&pRoot->field_0x18 & 0xffffffffffffffef | 0x10;
  pAVar2 = Aig_ObjFanin0(pRoot);
  *(ulong *)&pAVar2->field_0x18 = *(ulong *)&pAVar2->field_0x18 & 0xffffffffffffffef | 0x10;
  pAVar2 = Aig_ObjFanin1(pRoot);
  *(ulong *)&pAVar2->field_0x18 = *(ulong *)&pAVar2->field_0x18 & 0xffffffffffffffef | 0x10;
  do {
    iVar1 = Aig_ManFindCut_int(vFront,vVisited,nSizeLimit,nFanoutLimit);
  } while (iVar1 != 0);
  iVar1 = Vec_PtrSize(vFront);
  if (iVar1 <= nSizeLimit) {
    for (local_34 = 0; iVar1 = Vec_PtrSize(vVisited), local_34 < iVar1; local_34 = local_34 + 1) {
      pvVar3 = Vec_PtrEntry(vVisited,local_34);
      *(ulong *)((long)pvVar3 + 0x18) = *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffef;
    }
    return;
  }
  __assert_fail("Vec_PtrSize(vFront) <= nSizeLimit",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigWin.c"
                ,0xb0,"void Aig_ManFindCut(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
}

Assistant:

void Aig_ManFindCut( Aig_Obj_t * pRoot, Vec_Ptr_t * vFront, Vec_Ptr_t * vVisited, int nSizeLimit, int nFanoutLimit )
{
    Aig_Obj_t * pNode;
    int i;

    assert( !Aig_IsComplement(pRoot) );
    assert( Aig_ObjIsNode(pRoot) );
    assert( Aig_ObjChild0(pRoot) );
    assert( Aig_ObjChild1(pRoot) );

    // start the cut 
    Vec_PtrClear( vFront );
    Vec_PtrPush( vFront, Aig_ObjFanin0(pRoot) );
    Vec_PtrPush( vFront, Aig_ObjFanin1(pRoot) );

    // start the visited nodes
    Vec_PtrClear( vVisited );
    Vec_PtrPush( vVisited, pRoot );
    Vec_PtrPush( vVisited, Aig_ObjFanin0(pRoot) );
    Vec_PtrPush( vVisited, Aig_ObjFanin1(pRoot) );

    // mark these nodes
    assert( !pRoot->fMarkA );
    assert( !Aig_ObjFanin0(pRoot)->fMarkA );
    assert( !Aig_ObjFanin1(pRoot)->fMarkA );
    pRoot->fMarkA = 1;
    Aig_ObjFanin0(pRoot)->fMarkA = 1;
    Aig_ObjFanin1(pRoot)->fMarkA = 1;

    // compute the cut
    while ( Aig_ManFindCut_int( vFront, vVisited, nSizeLimit, nFanoutLimit ) );
    assert( Vec_PtrSize(vFront) <= nSizeLimit );

    // clean the visit markings
    Vec_PtrForEachEntry( Aig_Obj_t *, vVisited, pNode, i )
        pNode->fMarkA = 0;
}